

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O0

void __thiscall spdlog::details::t_formatter::t_formatter(t_formatter *this,padding_info padinfo)

{
  padding_info padinfo_00;
  t_formatter *this_local;
  padding_info padinfo_local;
  
  padinfo_00._12_4_ = 0;
  padinfo_00.width_ = SUB128(padinfo._0_12_,0);
  padinfo_00.side_ = SUB124(padinfo._0_12_,8);
  flag_formatter::flag_formatter(&this->super_flag_formatter,padinfo_00);
  (this->super_flag_formatter)._vptr_flag_formatter = (_func_int **)&PTR__t_formatter_003a3f98;
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, fmt::memory_buffer &dest) override
    {
        if (padinfo_.enabled())
        {
            const auto field_size = fmt_helper::count_digits(msg.thread_id);
            scoped_pad p(field_size, padinfo_, dest);
            fmt_helper::append_int(msg.thread_id, dest);
        }
        else
        {
            fmt_helper::append_int(msg.thread_id, dest);
        }
    }